

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O2

int callback_cancel(uint id)

{
  int pi;
  callback_t *__ptr;
  callback_t *pcVar1;
  callback_t *pcVar2;
  callback_t **ppcVar3;
  
  ppcVar3 = &gCallBackFirst;
  while( true ) {
    __ptr = *ppcVar3;
    if (__ptr == (callback_t *)0x0) {
      return -0x7da;
    }
    if (__ptr->id == id) break;
    ppcVar3 = &__ptr->next;
  }
  pi = __ptr->pi;
  pcVar1 = __ptr->prev;
  ppcVar3 = &gCallBackFirst;
  if (pcVar1 != (callback_t *)0x0) {
    ppcVar3 = &pcVar1->next;
  }
  pcVar2 = __ptr->next;
  *ppcVar3 = pcVar2;
  ppcVar3 = &gCallBackLast;
  if (pcVar2 != (callback_t *)0x0) {
    ppcVar3 = &pcVar2->prev;
  }
  *ppcVar3 = pcVar1;
  free(__ptr);
  findNotifyBits(pi);
  return 0;
}

Assistant:

int callback_cancel(unsigned id)
{
   callback_t *p;
   int pi;

   p = gCallBackFirst;

   while (p)
   {
      if (p->id == id)
      {
         pi = p->pi;

         if (p->prev) {p->prev->next = p->next;}
         else         {gCallBackFirst = p->next;}

         if (p->next) {p->next->prev = p->prev;}
         else         {gCallBackLast = p->prev;}

         free(p);

         findNotifyBits(pi);

         return 0;
      }
      p = p->next;
   }
   return pigif_callback_not_found;
}